

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O0

StringRef llvm::dwarf::DecimalSignString(uint Sign)

{
  undefined1 auStack_18 [4];
  uint Sign_local;
  
  switch(Sign) {
  case 1:
    StringRef::StringRef((StringRef *)auStack_18,"DW_DS_unsigned");
    break;
  case 2:
    StringRef::StringRef((StringRef *)auStack_18,"DW_DS_leading_overpunch");
    break;
  case 3:
    StringRef::StringRef((StringRef *)auStack_18,"DW_DS_trailing_overpunch");
    break;
  case 4:
    StringRef::StringRef((StringRef *)auStack_18,"DW_DS_leading_separate");
    break;
  case 5:
    StringRef::StringRef((StringRef *)auStack_18,"DW_DS_trailing_separate");
    break;
  default:
    memset(auStack_18,0,0x10);
    StringRef::StringRef((StringRef *)auStack_18);
  }
  return _auStack_18;
}

Assistant:

StringRef llvm::dwarf::DecimalSignString(unsigned Sign) {
  switch (Sign) {
  case DW_DS_unsigned:
    return "DW_DS_unsigned";
  case DW_DS_leading_overpunch:
    return "DW_DS_leading_overpunch";
  case DW_DS_trailing_overpunch:
    return "DW_DS_trailing_overpunch";
  case DW_DS_leading_separate:
    return "DW_DS_leading_separate";
  case DW_DS_trailing_separate:
    return "DW_DS_trailing_separate";
  }
  return StringRef();
}